

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::compiler::Resolution>::~ArrayBuilder
          (ArrayBuilder<capnp::compiler::Resolution> *this)

{
  Resolution *pRVar1;
  RemoveConst<capnp::compiler::Resolution> *pRVar2;
  Resolution *pRVar3;
  
  pRVar1 = this->ptr;
  if (pRVar1 != (Resolution *)0x0) {
    pRVar2 = this->pos;
    pRVar3 = this->endPtr;
    this->ptr = (Resolution *)0x0;
    this->pos = (RemoveConst<capnp::compiler::Resolution> *)0x0;
    this->endPtr = (Resolution *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pRVar1,0x20,(long)pRVar2 - (long)pRVar1 >> 5,
               (long)pRVar3 - (long)pRVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::compiler::Resolution>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }